

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::count(QStringView haystack,QChar needle,CaseSensitivity cs)

{
  const_iterator __first;
  int in_ECX;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  QChar *in_stack_ffffffffffffffb0;
  QChar *in_stack_ffffffffffffffb8;
  QChar *__last;
  QChar *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  anon_class_2_1_6297b9cd_for__M_pred __pred;
  difference_type local_28;
  QChar local_18 [8];
  long local_8;
  
  __pred.needle.ucs = SUB82((ulong)in_stack_ffffffffffffffc8 >> 0x30,0);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX == 1) {
    __last = local_18;
    __first = QStringView::cbegin((QStringView *)0x50f4d2);
    QStringView::cend((QStringView *)0x50f4e1);
    local_28 = std::count<QChar_const*,QChar>(__first,__last,in_stack_ffffffffffffffb0);
  }
  else {
    foldCase((QChar)(char16_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    QStringView::cbegin((QStringView *)0x50f538);
    QStringView::cend((QStringView *)0x50f547);
    local_28 = std::
               count_if<QChar_const*,QtPrivate::count(QStringView,QChar,Qt::CaseSensitivity)::__0>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__pred);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QChar needle, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return std::count(haystack.cbegin(), haystack.cend(), needle);

    needle = foldCase(needle);
    return std::count_if(haystack.cbegin(), haystack.cend(),
                         [needle](const QChar c) { return foldAndCompare(c, needle); });
}